

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSStreamInfo::MPLSStreamInfo(MPLSStreamInfo *this,PMTStreamInfo *pmtStreamInfo)

{
  PIPParams local_38;
  PMTStreamInfo *local_18;
  PMTStreamInfo *pmtStreamInfo_local;
  MPLSStreamInfo *this_local;
  
  local_18 = pmtStreamInfo;
  pmtStreamInfo_local = (PMTStreamInfo *)this;
  M2TSStreamInfo::M2TSStreamInfo(&this->super_M2TSStreamInfo,pmtStreamInfo);
  this->type = '\x01';
  this->offsetId = 0xff;
  this->isSSPG = false;
  this->SS_PG_offset_sequence_id = 0xff;
  this->leftEye = (MPLSStreamInfo *)0x0;
  this->rightEye = (MPLSStreamInfo *)0x0;
  PIPParams::PIPParams(&this->pipParams);
  AbstractStreamReader::getPipParams(&local_38,local_18->m_codecReader);
  (this->pipParams).scaleIndex = local_38.scaleIndex;
  (this->pipParams).corner = local_38.corner;
  (this->pipParams).hOffset = local_38.hOffset;
  (this->pipParams).vOffset = local_38.vOffset;
  (this->pipParams).lumma = local_38.lumma;
  return;
}

Assistant:

MPLSStreamInfo::MPLSStreamInfo(const PMTStreamInfo& pmtStreamInfo)
    : M2TSStreamInfo(pmtStreamInfo),
      type(1),
      offsetId(0xff),
      isSSPG(false),
      SS_PG_offset_sequence_id(0xff),
      leftEye(nullptr),
      rightEye(nullptr)
{
    pipParams = pmtStreamInfo.m_codecReader->getPipParams();
}